

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O2

bool Js::AsmJSCompiler::CheckFunctionTables(AsmJsModuleCompiler *m)

{
  uint size;
  AsmJSParser *ppPVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  ParseNode *this;
  ParseNodeVar *pPVar5;
  ParseNodeArrLit *pPVar6;
  PropertyName name;
  AsmJsSymbol *pAVar7;
  ParseNode *node;
  AsmJSParser node_00;
  char16_t *fmt;
  int iVar8;
  undefined4 *local_38;
  
  ppPVar1 = m->mCurrentParserNode;
  node_00 = *ppPVar1;
  if (node_00->nop == knopList) {
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_38 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                ,0x2df,"(list->nop == knopList)","list->nop == knopList");
    if (!bVar3) {
LAB_0085f5a0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_38 = 0;
    node_00 = *ppPVar1;
  }
  iVar8 = 0;
  do {
    if ((((node_00->nop == knopEndCode) ||
         (this = ParserWrapper::GetBinaryLeft(node_00), 1 < (byte)(this->nop + ~knopList))) ||
        (pPVar5 = ParseNode::AsParseNodeVar(this), pPVar5->pnodeInit == (ParseNodePtr)0x0)) ||
       (pPVar5 = ParseNode::AsParseNodeVar(this), pPVar5->pnodeInit->nop != knopArray)) {
      m->mFuncPtrTableCount = iVar8;
      *m->mCurrentParserNode = *ppPVar1;
      return true;
    }
    pPVar5 = ParseNode::AsParseNodeVar(this);
    pPVar6 = ParseNode::AsParseNodeArrLit(pPVar5->pnodeInit);
    size = pPVar6->count;
    name = ParseNode::name(this);
    if (((int)size < 1) || ((size + 0x7fffffff & size) != 0)) {
      fmt = L"Function table [%s] size must be a power of 2";
LAB_0085f573:
      bVar3 = AsmJsModuleCompiler::FailName(m,this,fmt,name);
      return bVar3;
    }
    bVar3 = AsmJsModuleCompiler::AddFunctionTable(m,name,size);
    name = ParseNode::name(this);
    if (!bVar3) {
      fmt = L"Unable to create new function table %s";
      goto LAB_0085f573;
    }
    pAVar7 = AsmJsModuleCompiler::LookupIdentifier(m,name,(AsmJsFunc *)0x0,(Source *)0x0);
    if (pAVar7 == (AsmJsSymbol *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *local_38 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                  ,0x2f8,"(ftable)","ftable");
      if (!bVar3) goto LAB_0085f5a0;
      *local_38 = 0;
    }
    pPVar5 = ParseNode::AsParseNodeVar(this);
    pPVar6 = ParseNode::AsParseNodeArrLit(pPVar5->pnodeInit);
    node = (pPVar6->super_ParseNodeUni).pnode1;
    OVar4 = node->nop;
    if (OVar4 == knopList) {
      node = ParserWrapper::GetBinaryLeft(node);
      OVar4 = node->nop;
    }
    if ((OVar4 != knopName) && (OVar4 != knopStr)) {
      name = ParseNode::name(this);
      fmt = L"Invalid element in function table %s";
      this = node;
      goto LAB_0085f573;
    }
    iVar8 = iVar8 + 1;
    node_00 = ParserWrapper::GetBinaryRight(*ppPVar1);
    *ppPVar1 = node_00;
  } while( true );
}

Assistant:

bool AsmJSCompiler::CheckFunctionTables(AsmJsModuleCompiler &m)
    {
        AsmJSParser& list = m.GetCurrentParserNode();
        Assert(list->nop == knopList);

        int32 funcPtrTableCount = 0;
        while (list->nop != knopEndCode)
        {
            ParseNode * varStmt = ParserWrapper::GetBinaryLeft(list);
            if (varStmt->nop != knopConstDecl && varStmt->nop != knopVarDecl)
            {
                break;
            }
            if (!varStmt->AsParseNodeVar()->pnodeInit || varStmt->AsParseNodeVar()->pnodeInit->nop != knopArray)
            {
                break;
            }
            const uint tableSize = varStmt->AsParseNodeVar()->pnodeInit->AsParseNodeArrLit()->count;
            if (!::Math::IsPow2(tableSize))
            {
                return m.FailName(varStmt, _u("Function table [%s] size must be a power of 2"), varStmt->name());
            }
            if (!m.AddFunctionTable(varStmt->name(), tableSize))
            {
                return m.FailName(varStmt, _u("Unable to create new function table %s"), varStmt->name());
            }

            AsmJsFunctionTable* ftable = (AsmJsFunctionTable*)m.LookupIdentifier(varStmt->name());
            Assert(ftable);
            ParseNode* pnode = varStmt->AsParseNodeVar()->pnodeInit->AsParseNodeArrLit()->pnode1;
            if (pnode->nop == knopList)
            {
                pnode = ParserWrapper::GetBinaryLeft(pnode);
            }
            if (!ParserWrapper::IsNameDeclaration(pnode))
            {
                return m.FailName(pnode, _u("Invalid element in function table %s"), varStmt->name());
            }
            ++funcPtrTableCount;
            list = ParserWrapper::GetBinaryRight(list);
        }

        m.SetFuncPtrTableCount(funcPtrTableCount);

        m.SetCurrentParseNode(list);
        return true;
    }